

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Matrix4x4 * __thiscall
CMU462::DynamicScene::SceneObject::getTransformation
          (Matrix4x4 *__return_storage_ptr__,SceneObject *this)

{
  Vector3D local_488;
  Matrix4x4 local_470;
  Matrix4x4 local_3f0;
  Matrix4x4 local_370;
  Matrix4x4 local_2f0;
  Vector3D local_270;
  Matrix4x4 local_258;
  Matrix4x4 local_1d8;
  Matrix4x4 local_158;
  Matrix4x4 local_d8;
  double local_58;
  double local_50;
  Vector3D local_48;
  undefined1 local_30 [8];
  Vector3D rot;
  SceneObject *this_local;
  
  local_50 = 3.141592653589793;
  rot.z = (double)this;
  Vector3D::operator*(&local_48,&this->rotation,&local_50);
  local_58 = 180.0;
  Vector3D::operator/((Vector3D *)local_30,&local_48,&local_58);
  Vector3D::Vector3D(&local_270,&this->position);
  Matrix4x4::translation(&local_258,&local_270);
  Matrix4x4::rotation(&local_2f0,(double)local_30,X);
  Matrix4x4::operator*(&local_1d8,&local_258,&local_2f0);
  Matrix4x4::rotation(&local_370,rot.x,Y);
  Matrix4x4::operator*(&local_158,&local_1d8,&local_370);
  Matrix4x4::rotation(&local_3f0,rot.y,Z);
  Matrix4x4::operator*(&local_d8,&local_158,&local_3f0);
  Vector3D::Vector3D(&local_488,&this->scale);
  Matrix4x4::scaling(&local_470,&local_488);
  Matrix4x4::operator*(__return_storage_ptr__,&local_d8,&local_470);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 SceneObject::getTransformation()
{
  Vector3D rot = rotation * M_PI / 180;
  return Matrix4x4::translation(position)
    * Matrix4x4::rotation(rot.x, Matrix4x4::Axis::X)
    * Matrix4x4::rotation(rot.y, Matrix4x4::Axis::Y)
    * Matrix4x4::rotation(rot.z, Matrix4x4::Axis::Z)
    * Matrix4x4::scaling(scale);
}